

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_main.cpp
# Opt level: O0

MeshGL * TetGL(void)

{
  initializer_list<unsigned_int> __l;
  initializer_list<unsigned_int> __l_00;
  initializer_list<unsigned_int> __l_01;
  initializer_list<float> __l_02;
  MeshGLP<float,_unsigned_int> *in_RDI;
  uint local_144 [3];
  iterator local_138;
  undefined8 local_130;
  uint local_124 [3];
  iterator local_118;
  undefined8 local_110;
  uint local_108 [12];
  iterator local_d8;
  undefined8 local_d0;
  float local_b4 [35];
  iterator local_28;
  undefined8 local_20;
  undefined1 local_11;
  MeshGL *tet;
  
  local_11 = 0;
  manifold::MeshGLP<float,_unsigned_int>::MeshGLP(in_RDI);
  in_RDI->numProp = 5;
  memcpy(local_b4,&DAT_0022d164,0x8c);
  local_20 = 0x23;
  __l_02._M_len = 0x23;
  __l_02._M_array = local_b4;
  local_28 = local_b4;
  std::vector<float,_std::allocator<float>_>::operator=(&in_RDI->vertProperties,__l_02);
  local_108[8] = 0;
  local_108[9] = 6;
  local_108[10] = 5;
  local_108[0xb] = 4;
  local_108[4] = 3;
  local_108[5] = 1;
  local_108[6] = 2;
  local_108[7] = 3;
  local_108[0] = 2;
  local_108[1] = 0;
  local_108[2] = 1;
  local_108[3] = 0;
  local_d8 = local_108;
  local_d0 = 0xc;
  __l_01._M_len = 0xc;
  __l_01._M_array = local_d8;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=(&in_RDI->triVerts,__l_01);
  local_124[0] = 4;
  local_124[1] = 5;
  local_124[2] = 6;
  local_118 = local_124;
  local_110 = 3;
  __l_00._M_len = 3;
  __l_00._M_array = local_118;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=(&in_RDI->mergeFromVert,__l_00)
  ;
  local_144[0] = 1;
  local_144[1] = 2;
  local_144[2] = 3;
  local_138 = local_144;
  local_130 = 3;
  __l._M_len = 3;
  __l._M_array = local_138;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=(&in_RDI->mergeToVert,__l);
  return in_RDI;
}

Assistant:

MeshGL TetGL() {
  MeshGL tet;
  tet.numProp = 5;
  tet.vertProperties = {-1, -1, 1,  0, 0,   //
                        -1, 1,  -1, 1, -1,  //
                        1,  -1, -1, 2, -2,  //
                        1,  1,  1,  3, -3,  //
                        -1, 1,  -1, 4, -4,  //
                        1,  -1, -1, 5, -5,  //
                        1,  1,  1,  6, -6};
  tet.triVerts = {2, 0, 1, 0, 3, 1, 2, 3, 0, 6, 5, 4};
  tet.mergeFromVert = {4, 5, 6};
  tet.mergeToVert = {1, 2, 3};
  return tet;
}